

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O0

double expected_sd_cat_internal<unsigned_long,unsigned_long,double>
                 (int ncat,unsigned_long *buffer_cnt,double cnt_l,unsigned_long *buffer_pos,
                 double *buffer_prob)

{
  undefined8 uVar1;
  unsigned_long uVar2;
  double *in_RCX;
  unsigned_long *in_RDX;
  long in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  undefined1 auVar3 [16];
  int cat;
  unsigned_long temp;
  int ncat_present;
  unsigned_long st_pos;
  int local_4c;
  int local_3c;
  long local_38;
  double local_8;
  
  std::iota<unsigned_long*,unsigned_long>(in_RDX,in_RDX + in_EDI,0);
  local_38 = 0;
  local_3c = 0;
  for (local_4c = 0; local_4c < in_EDI; local_4c = local_4c + 1) {
    if (*(long *)(in_RSI + (long)local_4c * 8) == 0) {
      uVar2 = in_RDX[local_38];
      in_RDX[local_38] = in_RDX[local_4c];
      in_RDX[local_4c] = uVar2;
      local_38 = local_38 + 1;
    }
    else {
      local_3c = local_3c + 1;
      uVar1 = *(undefined8 *)(in_RSI + (long)local_4c * 8);
      auVar3._8_4_ = (int)((ulong)uVar1 >> 0x20);
      auVar3._0_8_ = uVar1;
      auVar3._12_4_ = 0x45300000;
      in_RCX[local_4c] =
           ((auVar3._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) / in_XMM0_Qa;
    }
  }
  if (local_3c < 2) {
    local_8 = 0.0;
  }
  else {
    local_8 = expected_sd_cat<unsigned_long,double>(in_RCX,(long)local_3c,in_RDX + local_38);
  }
  return local_8;
}

Assistant:

double expected_sd_cat_internal(int ncat, number *restrict buffer_cnt, ldouble_safe cnt_l,
                                int_t *restrict buffer_pos, double *restrict buffer_prob)
{
    /* move zero-valued to the beginning */
    std::iota(buffer_pos, buffer_pos + ncat, (int_t)0);
    int_t st_pos = 0;
    int ncat_present = 0;
    int_t temp;
    for (int cat = 0; cat < ncat; cat++)
    {
        if (buffer_cnt[cat])
        {
            ncat_present++;
            buffer_prob[cat] = (ldouble_safe) buffer_cnt[cat] / cnt_l;
        }

        else
        {
            temp = buffer_pos[st_pos];
            buffer_pos[st_pos] = buffer_pos[cat];
            buffer_pos[cat] = temp;
            st_pos++;
        }
    }

    if (ncat_present <= 1) return 0;
    return expected_sd_cat<int_t, ldouble_safe>(buffer_prob, ncat_present, buffer_pos + st_pos);
}